

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O0

qsizetype bm_find(QStringView haystack,qsizetype index,QStringView needle,uchar *skiptable,
                 CaseSensitivity cs)

{
  ulong uVar1;
  QStringView s;
  bool bVar2;
  char32_t cVar3;
  storage_type_conflict *psVar4;
  qsizetype qVar5;
  storage_type_conflict *psVar6;
  long lVar7;
  ulong *puVar8;
  long lVar9;
  qsizetype qVar10;
  ulong uVar11;
  storage_type_conflict *in_RDX;
  QStringView *in_R9;
  long in_FS_OFFSET;
  int in_stack_00000008;
  qsizetype candidatePos;
  qsizetype skip_1;
  char16_t *end_1;
  char16_t *current_1;
  qsizetype foldBufferEnd;
  qsizetype i;
  char16_t *start;
  qsizetype foldBufferLength;
  qsizetype skip;
  char16_t *end;
  char16_t *current;
  qsizetype pl_minus_one;
  char16_t *puc;
  qsizetype l;
  char16_t *uc;
  QStringView restHaystack;
  QStringView restNeedle;
  qsizetype pl;
  char16_t foldBuffer [256];
  QStringView *in_stack_fffffffffffffcd8;
  char16_t *in_stack_fffffffffffffce0;
  QStringView *in_stack_fffffffffffffce8;
  QStringView *in_stack_fffffffffffffcf0;
  QStringView *this;
  storage_type_conflict *local_308;
  storage_type_conflict *local_2e8;
  long local_2d8;
  ulong local_2c0;
  storage_type_conflict *local_2b0;
  storage_type_conflict *local_278;
  long local_260;
  qsizetype local_258;
  QStringView local_250;
  QStringView local_240;
  ulong local_230;
  QStringView local_228;
  QStringView local_218;
  ushort local_208 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar4 = QStringView::utf16(&local_218);
  qVar5 = QStringView::size(&local_218);
  psVar6 = QStringView::utf16(&local_228);
  local_230 = QStringView::size(&local_228);
  if (local_230 == 0) {
    local_308 = in_RDX;
    if (qVar5 < (long)in_RDX) {
      local_308 = (storage_type_conflict *)0xffffffffffffffff;
    }
    local_278 = local_308;
  }
  else {
    if (in_stack_00000008 == 1) {
      lVar7 = local_230 - 1;
      for (local_2b0 = psVar4 + (long)in_RDX + lVar7; local_2b0 < psVar4 + qVar5;
          local_2b0 = local_2b0 + local_2c0) {
        local_2c0 = (ulong)*(byte *)((long)&in_R9->m_data + (long)(int)((ushort)*local_2b0 & 0xff));
        if (local_2c0 == 0) {
          for (local_2c0 = 0;
              ((long)local_2c0 < (long)local_230 &&
              (local_2b0[-local_2c0] == psVar6[lVar7 - local_2c0])); local_2c0 = local_2c0 + 1) {
          }
          if (lVar7 < (long)local_2c0) {
            local_278 = (storage_type_conflict *)(((long)local_2b0 - (long)psVar4 >> 1) - lVar7);
            goto LAB_00148241;
          }
          if (*(byte *)((long)&in_R9->m_data + (long)(int)((ushort)local_2b0[-local_2c0] & 0xff)) ==
              local_230) {
            local_2c0 = local_230 - local_2c0;
          }
          else {
            local_2c0 = 1;
          }
        }
        if (psVar4 + qVar5 + -local_2c0 < local_2b0) break;
      }
    }
    else {
      memset(local_208,0xaa,0x200);
      puVar8 = (ulong *)qMin<long_long>(&FoldBufferCapacity,(longlong *)&local_230);
      uVar1 = *puVar8;
      for (local_2d8 = 0; local_2d8 < (long)uVar1; local_2d8 = local_2d8 + 1) {
        cVar3 = foldCase(in_stack_fffffffffffffce0,(char16_t *)in_stack_fffffffffffffcd8);
        local_208[local_2d8] = (ushort)cVar3;
      }
      local_240.m_size = -0x5555555555555556;
      local_240.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_240 = QStringView::sliced(in_stack_fffffffffffffcf0,(qsizetype)in_stack_fffffffffffffce8
                                     );
      lVar7 = uVar1 - 1;
      for (local_2e8 = psVar4 + (long)in_RDX + lVar7; local_2e8 < psVar4 + qVar5;
          local_2e8 = local_2e8 + uVar11) {
        this = in_R9;
        cVar3 = foldCase(in_stack_fffffffffffffce0,(char16_t *)in_stack_fffffffffffffcd8);
        uVar11 = (ulong)*(byte *)((long)&this->m_data + (ulong)(uint)(cVar3 & 0xff));
        if (uVar11 == 0) {
          lVar9 = 0;
          while ((lVar9 < (long)uVar1 &&
                 (cVar3 = foldCase(in_stack_fffffffffffffce0,(char16_t *)in_stack_fffffffffffffcd8),
                 cVar3 == (uint)local_208[lVar7 - lVar9]))) {
            lVar9 = lVar9 + 1;
          }
          if (lVar7 < lVar9) {
            local_278 = (storage_type_conflict *)(((long)local_2e8 - (long)psVar4 >> 1) - lVar7);
            local_250.m_size = 0xaaaaaaaaaaaaaaaa;
            local_250.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
            local_258 = QStringView::size(&local_218);
            local_260 = (long)local_278 + uVar1;
            qMin<long_long>(&local_258,&local_260);
            local_250 = QStringView::sliced(this,(qsizetype)in_stack_fffffffffffffce8);
            qVar10 = QStringView::size(&local_240);
            if ((qVar10 == 0) ||
               (s.m_size = lVar9, s.m_data = local_278,
               bVar2 = QStringView::startsWith(in_stack_fffffffffffffcd8,s,CaseInsensitive), bVar2))
            goto LAB_00148241;
          }
          in_stack_fffffffffffffce8 = in_R9;
          cVar3 = foldCase(in_stack_fffffffffffffce0,(char16_t *)in_stack_fffffffffffffcd8);
          if (*(byte *)((long)&in_stack_fffffffffffffce8->m_data + (ulong)(uint)(cVar3 & 0xff)) ==
              uVar1) {
            uVar11 = uVar1 - lVar9;
          }
          else {
            uVar11 = 1;
          }
        }
        if (psVar4 + qVar5 + -uVar11 < local_2e8) break;
      }
    }
    local_278 = (storage_type_conflict *)0xffffffffffffffff;
  }
LAB_00148241:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (qsizetype)local_278;
}

Assistant:

static inline qsizetype bm_find(QStringView haystack, qsizetype index, QStringView needle,
                          const uchar *skiptable, Qt::CaseSensitivity cs)
{
    const char16_t *uc = haystack.utf16();
    const qsizetype l = haystack.size();
    const char16_t *puc = needle.utf16();
    const qsizetype pl = needle.size();

    if (pl == 0)
        return index > l ? -1 : index;

    if (cs == Qt::CaseSensitive) {
        const qsizetype pl_minus_one = pl - 1;
        const char16_t *current = uc + index + pl_minus_one;
        const char16_t *end = uc + l;

        while (current < end) {
            qsizetype skip = skiptable[*current & 0xff];
            if (!skip) {
                // possible match
                while (skip < pl) {
                    if (*(current - skip) != puc[pl_minus_one-skip])
                        break;
                    ++skip;
                }
                if (skip > pl_minus_one) // we have a match
                    return (current - uc) - pl_minus_one;

                // in case we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (skiptable[*(current - skip) & 0xff] == pl)
                    skip = pl - skip;
                else
                    skip = 1;
            }
            if (current > end - skip)
                break;
            current += skip;
        }
    } else {
        char16_t foldBuffer[FoldBufferCapacity];
        const qsizetype foldBufferLength = qMin(FoldBufferCapacity, pl);
        const char16_t *start = puc;
        for (qsizetype i = 0; i < foldBufferLength; ++i)
            foldBuffer[i] = foldCase(&puc[i], start);
        QStringView restNeedle = needle.sliced(foldBufferLength);
        const qsizetype foldBufferEnd = foldBufferLength - 1;
        const char16_t *current = uc + index + foldBufferEnd;
        const char16_t *end = uc + l;

        while (current < end) {
            qsizetype skip = skiptable[foldCase(current, uc) & 0xff];
            if (!skip) {
                // possible match
                while (skip < foldBufferLength) {
                    if (foldCase(current - skip, uc) != foldBuffer[foldBufferEnd - skip])
                        break;
                    ++skip;
                }
                if (skip > foldBufferEnd) { // Matching foldBuffer
                    qsizetype candidatePos = (current - uc) - foldBufferEnd;
                    QStringView restHaystack =
                            haystack.sliced(qMin(haystack.size(), candidatePos + foldBufferLength));
                    if (restNeedle.size() == 0
                        || restHaystack.startsWith(
                                restNeedle, Qt::CaseInsensitive)) // Check the rest of the string
                        return candidatePos;
                }
                // in case we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (skiptable[foldCase(current - skip, uc) & 0xff] == foldBufferLength)
                    skip = foldBufferLength - skip;
                else
                    skip = 1;
            }
            if (current > end - skip)
                break;
            current += skip;
        }
    }
    return -1; // not found
}